

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int val2;
  int val1;
  
  val1 = 10;
  val2 = 0x14;
  poVar1 = std::operator<<((ostream *)&std::cout,"before swap: val1=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
  poVar1 = std::operator<<(poVar1,", val2=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14);
  std::endl<char,std::char_traits<char>>(poVar1);
  swap(&val1,&val2);
  poVar1 = std::operator<<((ostream *)&std::cout,"after swap: val1=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,val1);
  poVar1 = std::operator<<(poVar1,", val2=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,val2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int val1 = 10;
    int val2 = 20;
    cout << "before swap: val1=" << val1 << ", val2=" << val2 << endl;
    swap(val1, val2);
    cout << "after swap: val1=" << val1 << ", val2=" << val2 << endl;
    return 0;
}